

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_set_text_compression_window_bits(png_structrp png_ptr,int window_bits)

{
  int local_14;
  int window_bits_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if (window_bits < 0x10) {
      local_14 = window_bits;
      if (window_bits < 8) {
        png_warning(png_ptr,"Only compression windows >= 256 supported by PNG");
        local_14 = 8;
      }
    }
    else {
      png_warning(png_ptr,"Only compression windows <= 32k supported by PNG");
      local_14 = 0xf;
    }
    png_ptr->zlib_text_window_bits = local_14;
  }
  return;
}

Assistant:

void PNGAPI
png_set_text_compression_window_bits(png_structrp png_ptr, int window_bits)
{
   if (png_ptr == NULL)
      return;

   if (window_bits > 15)
   {
      png_warning(png_ptr, "Only compression windows <= 32k supported by PNG");
      window_bits = 15;
   }

   else if (window_bits < 8)
   {
      png_warning(png_ptr, "Only compression windows >= 256 supported by PNG");
      window_bits = 8;
   }

   png_ptr->zlib_text_window_bits = window_bits;
}